

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CwiseUnaryOp.h
# Opt level: O3

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>>,3,0>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                 (redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *eval,scalar_max_op<double,_double,_0> *func,
                 CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 *xpr)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  Scalar elements [2];
  double dVar8;
  undefined1 auVar9 [16];
  Packet2d mask;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  uVar3 = (xpr->m_xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols * (xpr->m_xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows;
  uVar5 = uVar3 + 3;
  if (-1 < (long)uVar3) {
    uVar5 = uVar3;
  }
  pdVar2 = (eval->
           super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           ).
           super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
           .m_d.argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
           data;
  if (uVar3 + 1 < 3) {
    return ABS(*pdVar2);
  }
  uVar4 = uVar3 - ((long)uVar3 >> 0x3f) & 0xfffffffffffffffe;
  auVar11._0_8_ = ABS(*pdVar2);
  auVar11._8_8_ = ABS(pdVar2[1]);
  if (3 < (long)uVar3) {
    uVar5 = uVar5 & 0xfffffffffffffffc;
    auVar13._0_8_ = ABS(pdVar2[2]);
    auVar13._8_8_ = ABS(pdVar2[3]);
    if (uVar3 < 8) {
    }
    else {
      lVar6 = 4;
      do {
        pdVar1 = pdVar2 + lVar6;
        auVar10._0_8_ = ABS(*pdVar1);
        auVar10._8_4_ = *(undefined4 *)(pdVar1 + 1);
        auVar10._12_4_ = *(uint *)((long)pdVar1 + 0xc) & 0x7fffffff;
        auVar11 = maxpd(auVar10,auVar11);
        pdVar1 = pdVar2 + lVar6 + 2;
        auVar12._0_8_ = ABS(*pdVar1);
        auVar12._8_4_ = *(undefined4 *)(pdVar1 + 1);
        auVar12._12_4_ = *(uint *)((long)pdVar1 + 0xc) & 0x7fffffff;
        auVar13 = maxpd(auVar12,auVar13);
        lVar6 = lVar6 + 4;
      } while (lVar6 < (long)uVar5);
    }
    auVar11 = maxpd(auVar13,auVar11);
    if ((long)uVar5 < (long)uVar4) {
      pdVar1 = pdVar2 + uVar5;
      auVar9._0_8_ = ABS(*pdVar1);
      auVar9._8_4_ = *(undefined4 *)(pdVar1 + 1);
      auVar9._12_4_ = *(uint *)((long)pdVar1 + 0xc) & 0x7fffffff;
      auVar11 = maxpd(auVar9,auVar11);
    }
  }
  dVar8 = auVar11._8_8_;
  if (auVar11._8_8_ <= auVar11._0_8_) {
    dVar8 = auVar11._0_8_;
  }
  if ((long)uVar3 <= (long)uVar4) {
    return dVar8;
  }
  do {
    dVar7 = ABS(pdVar2[uVar4]);
    if (ABS(pdVar2[uVar4]) <= dVar8) {
      dVar7 = dVar8;
    }
    uVar4 = uVar4 + 1;
    dVar8 = dVar7;
  } while (uVar3 - uVar4 != 0);
  return dVar7;
}

Assistant:

EIGEN_CONSTEXPR
    Index rows() const EIGEN_NOEXCEPT { return m_xpr.rows(); }